

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldLiteGenerator::
ImmutablePrimitiveOneofFieldLiteGenerator
          (ImmutablePrimitiveOneofFieldLiteGenerator *this,FieldDescriptor *descriptor,
          int messageBitIndex,Context *context)

{
  OneofGeneratorInfo *info;
  OneofDescriptor *oneof;
  
  ImmutablePrimitiveFieldLiteGenerator::ImmutablePrimitiveFieldLiteGenerator
            (&this->super_ImmutablePrimitiveFieldLiteGenerator,descriptor,messageBitIndex,context);
  (this->super_ImmutablePrimitiveFieldLiteGenerator).super_ImmutableFieldLiteGenerator.
  _vptr_ImmutableFieldLiteGenerator =
       (_func_int **)&PTR__ImmutablePrimitiveOneofFieldLiteGenerator_004dfe90;
  if (((byte)descriptor[1] & 0x10) == 0) {
    oneof = (OneofDescriptor *)0x0;
  }
  else {
    oneof = *(OneofDescriptor **)(descriptor + 0x28);
  }
  info = Context::GetOneofGeneratorInfo(context,oneof);
  SetCommonOneofVariables
            (descriptor,info,&(this->super_ImmutablePrimitiveFieldLiteGenerator).variables_);
  return;
}

Assistant:

ImmutablePrimitiveOneofFieldLiteGenerator::
    ImmutablePrimitiveOneofFieldLiteGenerator(const FieldDescriptor* descriptor,
                                              int messageBitIndex,
                                              Context* context)
    : ImmutablePrimitiveFieldLiteGenerator(descriptor, messageBitIndex,
                                           context) {
  const OneofGeneratorInfo* info =
      context->GetOneofGeneratorInfo(descriptor->containing_oneof());
  SetCommonOneofVariables(descriptor, info, &variables_);
}